

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iadst8x8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  byte bVar1;
  __m128i offset_2;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar8;
  undefined1 auVar7 [16];
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  uint uVar14;
  int iVar18;
  int iVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar19;
  uint uVar21;
  int iVar22;
  uint uVar23;
  undefined1 auVar17 [16];
  int iVar25;
  int iVar26;
  undefined1 auVar24 [16];
  int iVar27;
  int iVar28;
  int iVar32;
  int iVar34;
  undefined1 auVar30 [16];
  int iVar29;
  int iVar33;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar31 [16];
  int iVar38;
  uint uVar39;
  int iVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  __m128i offset;
  undefined1 auVar40 [16];
  int iVar45;
  uint uVar46;
  undefined1 auVar47 [16];
  uint uVar48;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  int iVar61;
  int iVar65;
  undefined1 auVar59 [16];
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  int iVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined1 auVar60 [16];
  uint uVar73;
  uint uVar75;
  uint uVar76;
  undefined1 auVar74 [16];
  uint uVar77;
  undefined1 auVar78 [16];
  int iVar79;
  int iVar81;
  int iVar82;
  undefined1 auVar80 [16];
  int iVar83;
  int iVar84;
  uint uVar85;
  int iVar86;
  uint uVar87;
  int iVar88;
  uint uVar89;
  int iVar90;
  uint uVar91;
  int iVar92;
  uint uVar93;
  int iVar94;
  int iVar98;
  int iVar100;
  int iVar101;
  int iVar103;
  undefined1 auVar95 [16];
  int iVar104;
  int iVar105;
  undefined1 auVar96 [16];
  uint uVar99;
  uint uVar102;
  uint uVar106;
  undefined1 auVar97 [16];
  int iVar107;
  
  auVar17._8_4_ = 0xfec;
  auVar17._0_8_ = 0xfec00000fec;
  auVar17._12_4_ = 0xfec;
  auVar78._8_4_ = 0x191;
  auVar78._0_8_ = 0x19100000191;
  auVar78._12_4_ = 0x191;
  auVar31._8_4_ = 0xe1c;
  auVar31._0_8_ = 0xe1c00000e1c;
  auVar31._12_4_ = 0xe1c;
  auVar49._8_4_ = 0x78b;
  auVar49._0_8_ = 0x78b0000078b;
  auVar49._12_4_ = 0x78b;
  auVar74._8_4_ = 0xa26;
  auVar74._0_8_ = 0xa2600000a26;
  auVar74._12_4_ = 0xa26;
  auVar54._8_4_ = 0xc5e;
  auVar54._0_8_ = 0xc5e00000c5e;
  auVar54._12_4_ = 0xc5e;
  auVar53._8_4_ = 0x4a5;
  auVar53._0_8_ = 0x4a5000004a5;
  auVar53._12_4_ = 0x4a5;
  auVar47._8_4_ = 0xf50;
  auVar47._0_8_ = 0xf5000000f50;
  auVar47._12_4_ = 0xf50;
  auVar2 = pmulld((undefined1  [16])in[0xe],auVar17);
  auVar10 = pmulld(auVar17,(undefined1  [16])*in);
  auVar40 = pmulld((undefined1  [16])*in,auVar78);
  auVar95 = pmulld((undefined1  [16])in[0xe],auVar78);
  auVar3 = pmulld((undefined1  [16])in[10],auVar31);
  auVar11 = pmulld(auVar31,(undefined1  [16])in[4]);
  auVar80 = pmulld((undefined1  [16])in[4],auVar49);
  auVar59 = pmulld((undefined1  [16])in[10],auVar49);
  auVar4 = pmulld((undefined1  [16])in[6],auVar74);
  auVar30 = pmulld((undefined1  [16])in[8],auVar54);
  auVar7 = pmulld((undefined1  [16])in[6],auVar54);
  auVar15 = pmulld((undefined1  [16])in[8],auVar74);
  auVar5 = pmulld((undefined1  [16])in[2],auVar53);
  auVar24 = pmulld((undefined1  [16])in[0xc],auVar47);
  auVar12 = pmulld((undefined1  [16])in[2],auVar47);
  auVar16 = pmulld((undefined1  [16])in[0xc],auVar53);
  auVar6 = pmovsxwd(auVar5,0x800080008000800);
  iVar94 = auVar6._0_4_;
  iVar100 = auVar6._4_4_;
  iVar103 = auVar6._8_4_;
  iVar107 = auVar6._12_4_;
  iVar38 = auVar40._0_4_ + auVar2._0_4_ + iVar94 >> 0xc;
  iVar41 = auVar40._4_4_ + auVar2._4_4_ + iVar100 >> 0xc;
  iVar43 = auVar40._8_4_ + auVar2._8_4_ + iVar103 >> 0xc;
  iVar45 = auVar40._12_4_ + auVar2._12_4_ + iVar107 >> 0xc;
  iVar28 = auVar30._0_4_ + auVar4._0_4_ + iVar94 >> 0xc;
  iVar32 = auVar30._4_4_ + auVar4._4_4_ + iVar100 >> 0xc;
  iVar34 = auVar30._8_4_ + auVar4._8_4_ + iVar103 >> 0xc;
  iVar36 = auVar30._12_4_ + auVar4._12_4_ + iVar107 >> 0xc;
  iVar13 = iVar28 + iVar38;
  iVar18 = iVar32 + iVar41;
  iVar20 = iVar34 + iVar43;
  iVar22 = iVar36 + iVar45;
  iVar38 = iVar38 - iVar28;
  iVar41 = iVar41 - iVar32;
  iVar43 = iVar43 - iVar34;
  iVar45 = iVar45 - iVar36;
  iVar92 = (auVar95._0_4_ - auVar10._0_4_) + iVar94 >> 0xc;
  iVar98 = (auVar95._4_4_ - auVar10._4_4_) + iVar100 >> 0xc;
  iVar101 = (auVar95._8_4_ - auVar10._8_4_) + iVar103 >> 0xc;
  iVar104 = (auVar95._12_4_ - auVar10._12_4_) + iVar107 >> 0xc;
  iVar28 = (auVar7._0_4_ - auVar15._0_4_) + iVar94 >> 0xc;
  iVar32 = (auVar7._4_4_ - auVar15._4_4_) + iVar100 >> 0xc;
  iVar34 = (auVar7._8_4_ - auVar15._8_4_) + iVar103 >> 0xc;
  iVar36 = (auVar7._12_4_ - auVar15._12_4_) + iVar107 >> 0xc;
  iVar84 = iVar28 + iVar92;
  iVar86 = iVar32 + iVar98;
  iVar88 = iVar34 + iVar101;
  iVar90 = iVar36 + iVar104;
  iVar92 = iVar92 - iVar28;
  iVar98 = iVar98 - iVar32;
  iVar101 = iVar101 - iVar34;
  iVar104 = iVar104 - iVar36;
  iVar32 = do_cols + 6 + (uint)(bit == 0) * 2;
  iVar79 = auVar80._0_4_ + auVar3._0_4_ + iVar94 >> 0xc;
  iVar81 = auVar80._4_4_ + auVar3._4_4_ + iVar100 >> 0xc;
  iVar82 = auVar80._8_4_ + auVar3._8_4_ + iVar103 >> 0xc;
  iVar83 = auVar80._12_4_ + auVar3._12_4_ + iVar107 >> 0xc;
  iVar28 = auVar24._0_4_ + auVar5._0_4_ + iVar94 >> 0xc;
  iVar25 = auVar24._4_4_ + auVar5._4_4_ + iVar100 >> 0xc;
  iVar26 = auVar24._8_4_ + auVar5._8_4_ + iVar103 >> 0xc;
  iVar27 = auVar24._12_4_ + auVar5._12_4_ + iVar107 >> 0xc;
  iVar34 = iVar28 + iVar79;
  iVar36 = iVar25 + iVar81;
  iVar8 = iVar26 + iVar82;
  iVar9 = iVar27 + iVar83;
  iVar79 = iVar79 - iVar28;
  iVar81 = iVar81 - iVar25;
  iVar82 = iVar82 - iVar26;
  iVar83 = iVar83 - iVar27;
  iVar28 = 0x8000;
  if (0xf < iVar32) {
    iVar28 = 1 << ((char)iVar32 - 1U & 0x1f);
  }
  iVar55 = (auVar59._0_4_ - auVar11._0_4_) + iVar94 >> 0xc;
  iVar61 = (auVar59._4_4_ - auVar11._4_4_) + iVar100 >> 0xc;
  iVar65 = (auVar59._8_4_ - auVar11._8_4_) + iVar103 >> 0xc;
  iVar69 = (auVar59._12_4_ - auVar11._12_4_) + iVar107 >> 0xc;
  iVar32 = (auVar12._0_4_ - auVar16._0_4_) + iVar94 >> 0xc;
  iVar25 = (auVar12._4_4_ - auVar16._4_4_) + iVar100 >> 0xc;
  iVar26 = (auVar12._8_4_ - auVar16._8_4_) + iVar103 >> 0xc;
  iVar27 = (auVar12._12_4_ - auVar16._12_4_) + iVar107 >> 0xc;
  iVar29 = iVar32 + iVar55;
  iVar33 = iVar25 + iVar61;
  iVar35 = iVar26 + iVar65;
  iVar37 = iVar27 + iVar69;
  iVar55 = iVar55 - iVar32;
  iVar61 = iVar61 - iVar25;
  iVar65 = iVar65 - iVar26;
  iVar69 = iVar69 - iVar27;
  iVar32 = -iVar28;
  iVar28 = iVar28 + -1;
  auVar12._8_4_ = 0x61f;
  auVar12._0_8_ = 0x61f0000061f;
  auVar12._12_4_ = 0x61f;
  uVar39 = (uint)(iVar38 < iVar32) * iVar32 | (uint)(iVar38 >= iVar32) * iVar38;
  uVar42 = (uint)(iVar41 < iVar32) * iVar32 | (uint)(iVar41 >= iVar32) * iVar41;
  uVar44 = (uint)(iVar43 < iVar32) * iVar32 | (uint)(iVar43 >= iVar32) * iVar43;
  uVar46 = (uint)(iVar45 < iVar32) * iVar32 | (uint)(iVar45 >= iVar32) * iVar45;
  auVar3._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar3._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar3._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar3._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar92 < iVar32) * iVar32 | (uint)(iVar92 >= iVar32) * iVar92;
  uVar42 = (uint)(iVar98 < iVar32) * iVar32 | (uint)(iVar98 >= iVar32) * iVar98;
  uVar44 = (uint)(iVar101 < iVar32) * iVar32 | (uint)(iVar101 >= iVar32) * iVar101;
  uVar46 = (uint)(iVar104 < iVar32) * iVar32 | (uint)(iVar104 >= iVar32) * iVar104;
  auVar16._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar16._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar16._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar16._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  auVar10._8_4_ = 0xec8;
  auVar10._0_8_ = 0xec800000ec8;
  auVar10._12_4_ = 0xec8;
  auVar4 = pmulld(auVar3,auVar10);
  auVar5 = pmulld(auVar10,auVar16);
  auVar16 = pmulld(auVar16,auVar12);
  auVar2 = pmulld(auVar3,auVar12);
  auVar6._8_4_ = 0xfffff9e1;
  auVar6._0_8_ = 0xfffff9e1fffff9e1;
  auVar6._12_4_ = 0xfffff9e1;
  uVar39 = (uint)(iVar79 < iVar32) * iVar32 | (uint)(iVar79 >= iVar32) * iVar79;
  uVar42 = (uint)(iVar81 < iVar32) * iVar32 | (uint)(iVar81 >= iVar32) * iVar81;
  uVar44 = (uint)(iVar82 < iVar32) * iVar32 | (uint)(iVar82 >= iVar32) * iVar82;
  uVar46 = (uint)(iVar83 < iVar32) * iVar32 | (uint)(iVar83 >= iVar32) * iVar83;
  auVar15._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar15._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar15._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar15._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar55 < iVar32) * iVar32 | (uint)(iVar55 >= iVar32) * iVar55;
  uVar42 = (uint)(iVar61 < iVar32) * iVar32 | (uint)(iVar61 >= iVar32) * iVar61;
  uVar44 = (uint)(iVar65 < iVar32) * iVar32 | (uint)(iVar65 >= iVar32) * iVar65;
  uVar46 = (uint)(iVar69 < iVar32) * iVar32 | (uint)(iVar69 >= iVar32) * iVar69;
  auVar11._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar11._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar11._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar11._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  auVar3 = pmulld(auVar15,auVar6);
  auVar7 = pmulld(auVar6,auVar11);
  auVar11 = pmulld(auVar11,auVar10);
  auVar15 = pmulld(auVar15,auVar10);
  uVar39 = (uint)(iVar13 < iVar32) * iVar32 | (uint)(iVar13 >= iVar32) * iVar13;
  uVar42 = (uint)(iVar18 < iVar32) * iVar32 | (uint)(iVar18 >= iVar32) * iVar18;
  uVar44 = (uint)(iVar20 < iVar32) * iVar32 | (uint)(iVar20 >= iVar32) * iVar20;
  uVar46 = (uint)(iVar22 < iVar32) * iVar32 | (uint)(iVar22 >= iVar32) * iVar22;
  uVar14 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar19 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar21 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar23 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar34 < iVar32) * iVar32 | (uint)(iVar34 >= iVar32) * iVar34;
  uVar42 = (uint)(iVar36 < iVar32) * iVar32 | (uint)(iVar36 >= iVar32) * iVar36;
  uVar44 = (uint)(iVar8 < iVar32) * iVar32 | (uint)(iVar8 >= iVar32) * iVar8;
  uVar46 = (uint)(iVar9 < iVar32) * iVar32 | (uint)(iVar9 >= iVar32) * iVar9;
  uVar39 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar42 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar44 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar46 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  iVar81 = uVar39 + uVar14;
  iVar82 = uVar42 + uVar19;
  iVar83 = uVar44 + uVar21;
  iVar92 = uVar46 + uVar23;
  iVar13 = uVar14 - uVar39;
  iVar18 = uVar19 - uVar42;
  iVar20 = uVar21 - uVar44;
  iVar22 = uVar23 - uVar46;
  uVar39 = (uint)(iVar84 < iVar32) * iVar32 | (uint)(iVar84 >= iVar32) * iVar84;
  uVar42 = (uint)(iVar86 < iVar32) * iVar32 | (uint)(iVar86 >= iVar32) * iVar86;
  uVar44 = (uint)(iVar88 < iVar32) * iVar32 | (uint)(iVar88 >= iVar32) * iVar88;
  uVar46 = (uint)(iVar90 < iVar32) * iVar32 | (uint)(iVar90 >= iVar32) * iVar90;
  uVar14 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar19 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar21 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar23 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar29 < iVar32) * iVar32 | (uint)(iVar29 >= iVar32) * iVar29;
  uVar42 = (uint)(iVar33 < iVar32) * iVar32 | (uint)(iVar33 >= iVar32) * iVar33;
  uVar44 = (uint)(iVar35 < iVar32) * iVar32 | (uint)(iVar35 >= iVar32) * iVar35;
  uVar46 = (uint)(iVar37 < iVar32) * iVar32 | (uint)(iVar37 >= iVar32) * iVar37;
  uVar39 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar42 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar44 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar46 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  iVar34 = uVar39 + uVar14;
  iVar36 = uVar42 + uVar19;
  iVar8 = uVar44 + uVar21;
  iVar9 = uVar46 + uVar23;
  iVar33 = uVar14 - uVar39;
  iVar35 = uVar19 - uVar42;
  iVar37 = uVar21 - uVar44;
  iVar55 = uVar23 - uVar46;
  iVar61 = auVar16._0_4_ + auVar4._0_4_ + iVar94 >> 0xc;
  iVar65 = auVar16._4_4_ + auVar4._4_4_ + iVar100 >> 0xc;
  iVar69 = auVar16._8_4_ + auVar4._8_4_ + iVar103 >> 0xc;
  iVar105 = auVar16._12_4_ + auVar4._12_4_ + iVar107 >> 0xc;
  iVar41 = auVar11._0_4_ + auVar3._0_4_ + iVar94 >> 0xc;
  iVar43 = auVar11._4_4_ + auVar3._4_4_ + iVar100 >> 0xc;
  iVar45 = auVar11._8_4_ + auVar3._8_4_ + iVar103 >> 0xc;
  iVar79 = auVar11._12_4_ + auVar3._12_4_ + iVar107 >> 0xc;
  iVar25 = iVar41 + iVar61;
  iVar26 = iVar43 + iVar65;
  iVar27 = iVar45 + iVar69;
  iVar38 = iVar79 + iVar105;
  iVar61 = iVar61 - iVar41;
  iVar65 = iVar65 - iVar43;
  iVar69 = iVar69 - iVar45;
  iVar105 = iVar105 - iVar79;
  iVar41 = (auVar2._0_4_ - auVar5._0_4_) + iVar94 >> 0xc;
  iVar43 = (auVar2._4_4_ - auVar5._4_4_) + iVar100 >> 0xc;
  iVar45 = (auVar2._8_4_ - auVar5._8_4_) + iVar103 >> 0xc;
  iVar79 = (auVar2._12_4_ - auVar5._12_4_) + iVar107 >> 0xc;
  iVar98 = (auVar15._0_4_ - auVar7._0_4_) + iVar94 >> 0xc;
  iVar101 = (auVar15._4_4_ - auVar7._4_4_) + iVar100 >> 0xc;
  iVar104 = (auVar15._8_4_ - auVar7._8_4_) + iVar103 >> 0xc;
  iVar29 = (auVar15._12_4_ - auVar7._12_4_) + iVar107 >> 0xc;
  iVar84 = iVar98 + iVar41;
  iVar86 = iVar101 + iVar43;
  iVar88 = iVar104 + iVar45;
  iVar90 = iVar29 + iVar79;
  iVar41 = iVar41 - iVar98;
  iVar43 = iVar43 - iVar101;
  iVar45 = iVar45 - iVar104;
  iVar79 = iVar79 - iVar29;
  uVar39 = (uint)(iVar13 < iVar32) * iVar32 | (uint)(iVar13 >= iVar32) * iVar13;
  uVar42 = (uint)(iVar18 < iVar32) * iVar32 | (uint)(iVar18 >= iVar32) * iVar18;
  uVar44 = (uint)(iVar20 < iVar32) * iVar32 | (uint)(iVar20 >= iVar32) * iVar20;
  uVar46 = (uint)(iVar22 < iVar32) * iVar32 | (uint)(iVar22 >= iVar32) * iVar22;
  auVar2._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar2._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar2._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar2._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar33 < iVar32) * iVar32 | (uint)(iVar33 >= iVar32) * iVar33;
  uVar42 = (uint)(iVar35 < iVar32) * iVar32 | (uint)(iVar35 >= iVar32) * iVar35;
  uVar44 = (uint)(iVar37 < iVar32) * iVar32 | (uint)(iVar37 >= iVar32) * iVar37;
  uVar46 = (uint)(iVar55 < iVar32) * iVar32 | (uint)(iVar55 >= iVar32) * iVar55;
  auVar7._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar7._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar7._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar7._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  auVar5._8_4_ = 0xb50;
  auVar5._0_8_ = 0xb5000000b50;
  auVar5._12_4_ = 0xb50;
  auVar2 = pmulld(auVar2,auVar5);
  auVar7 = pmulld(auVar7,auVar5);
  uVar39 = (uint)(iVar61 < iVar32) * iVar32 | (uint)(iVar61 >= iVar32) * iVar61;
  uVar42 = (uint)(iVar65 < iVar32) * iVar32 | (uint)(iVar65 >= iVar32) * iVar65;
  uVar44 = (uint)(iVar69 < iVar32) * iVar32 | (uint)(iVar69 >= iVar32) * iVar69;
  uVar46 = (uint)(iVar105 < iVar32) * iVar32 | (uint)(iVar105 >= iVar32) * iVar105;
  auVar24._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar24._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar24._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar24._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar41 < iVar32) * iVar32 | (uint)(iVar41 >= iVar32) * iVar41;
  uVar42 = (uint)(iVar43 < iVar32) * iVar32 | (uint)(iVar43 >= iVar32) * iVar43;
  uVar44 = (uint)(iVar45 < iVar32) * iVar32 | (uint)(iVar45 >= iVar32) * iVar45;
  uVar46 = (uint)(iVar79 < iVar32) * iVar32 | (uint)(iVar79 >= iVar32) * iVar79;
  auVar4._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar4._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar4._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar4._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  auVar11 = pmulld(auVar24,auVar5);
  auVar3 = pmulld(auVar4,auVar5);
  uVar39 = (uint)(iVar81 < iVar32) * iVar32 | (uint)(iVar81 >= iVar32) * iVar81;
  uVar42 = (uint)(iVar82 < iVar32) * iVar32 | (uint)(iVar82 >= iVar32) * iVar82;
  uVar44 = (uint)(iVar83 < iVar32) * iVar32 | (uint)(iVar83 >= iVar32) * iVar83;
  uVar46 = (uint)(iVar92 < iVar32) * iVar32 | (uint)(iVar92 >= iVar32) * iVar92;
  uVar48 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar50 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar51 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar52 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar34 < iVar32) * iVar32 | (uint)(iVar34 >= iVar32) * iVar34;
  uVar42 = (uint)(iVar36 < iVar32) * iVar32 | (uint)(iVar36 >= iVar32) * iVar36;
  uVar44 = (uint)(iVar8 < iVar32) * iVar32 | (uint)(iVar8 >= iVar32) * iVar8;
  uVar46 = (uint)(iVar9 < iVar32) * iVar32 | (uint)(iVar9 >= iVar32) * iVar9;
  uVar14 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar19 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar21 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar23 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar25 < iVar32) * iVar32 | (uint)(iVar25 >= iVar32) * iVar25;
  uVar42 = (uint)(iVar26 < iVar32) * iVar32 | (uint)(iVar26 >= iVar32) * iVar26;
  uVar44 = (uint)(iVar27 < iVar32) * iVar32 | (uint)(iVar27 >= iVar32) * iVar27;
  uVar46 = (uint)(iVar38 < iVar32) * iVar32 | (uint)(iVar38 >= iVar32) * iVar38;
  uVar39 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar42 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar44 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar46 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar56 = (uint)(iVar84 < iVar32) * iVar32 | (uint)(iVar84 >= iVar32) * iVar84;
  uVar62 = (uint)(iVar86 < iVar32) * iVar32 | (uint)(iVar86 >= iVar32) * iVar86;
  uVar66 = (uint)(iVar88 < iVar32) * iVar32 | (uint)(iVar88 >= iVar32) * iVar88;
  uVar70 = (uint)(iVar90 < iVar32) * iVar32 | (uint)(iVar90 >= iVar32) * iVar90;
  uVar57 = (uint)(iVar28 < (int)uVar56) * iVar28 | (iVar28 >= (int)uVar56) * uVar56;
  uVar63 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  uVar67 = (uint)(iVar28 < (int)uVar66) * iVar28 | (iVar28 >= (int)uVar66) * uVar66;
  uVar71 = (uint)(iVar28 < (int)uVar70) * iVar28 | (iVar28 >= (int)uVar70) * uVar70;
  iVar34 = auVar7._0_4_ + auVar2._0_4_ + iVar94 >> 0xc;
  iVar36 = auVar7._4_4_ + auVar2._4_4_ + iVar100 >> 0xc;
  iVar8 = auVar7._8_4_ + auVar2._8_4_ + iVar103 >> 0xc;
  iVar9 = auVar7._12_4_ + auVar2._12_4_ + iVar107 >> 0xc;
  uVar56 = (auVar2._0_4_ - auVar7._0_4_) + iVar94 >> 0xc;
  uVar62 = (auVar2._4_4_ - auVar7._4_4_) + iVar100 >> 0xc;
  uVar66 = (auVar2._8_4_ - auVar7._8_4_) + iVar103 >> 0xc;
  uVar70 = (auVar2._12_4_ - auVar7._12_4_) + iVar107 >> 0xc;
  uVar85 = auVar3._0_4_ + auVar11._0_4_ + iVar94 >> 0xc;
  uVar87 = auVar3._4_4_ + auVar11._4_4_ + iVar100 >> 0xc;
  uVar89 = auVar3._8_4_ + auVar11._8_4_ + iVar103 >> 0xc;
  uVar91 = auVar3._12_4_ + auVar11._12_4_ + iVar107 >> 0xc;
  iVar13 = (auVar11._0_4_ - auVar3._0_4_) + iVar94 >> 0xc;
  iVar18 = (auVar11._4_4_ - auVar3._4_4_) + iVar100 >> 0xc;
  iVar20 = (auVar11._8_4_ - auVar3._8_4_) + iVar103 >> 0xc;
  iVar22 = (auVar11._12_4_ - auVar3._12_4_) + iVar107 >> 0xc;
  if (bit == 0) {
    bVar1 = 10;
    if (10 < do_cols) {
      bVar1 = (byte)do_cols;
    }
    iVar26 = 0x20 << (bVar1 & 0x1f);
    iVar25 = -iVar26;
    iVar26 = iVar26 + -1;
    iVar27 = (1 << ((byte)bd & 0x1f)) >> 1;
    auVar2 = ZEXT416((uint)bd);
    iVar38 = (int)(uVar48 + iVar27) >> auVar2;
    iVar41 = (int)(uVar50 + iVar27) >> auVar2;
    iVar43 = (int)(uVar51 + iVar27) >> auVar2;
    iVar45 = (int)(uVar52 + iVar27) >> auVar2;
    iVar79 = (int)(iVar27 - uVar39) >> auVar2;
    iVar81 = (int)(iVar27 - uVar42) >> auVar2;
    iVar82 = (int)(iVar27 - uVar44) >> auVar2;
    iVar83 = (int)(iVar27 - uVar46) >> auVar2;
    uVar39 = (uint)(iVar38 < iVar25) * iVar25 | (uint)(iVar38 >= iVar25) * iVar38;
    uVar42 = (uint)(iVar41 < iVar25) * iVar25 | (uint)(iVar41 >= iVar25) * iVar41;
    uVar44 = (uint)(iVar43 < iVar25) * iVar25 | (uint)(iVar43 >= iVar25) * iVar43;
    uVar46 = (uint)(iVar45 < iVar25) * iVar25 | (uint)(iVar45 >= iVar25) * iVar45;
    uVar48 = (uint)(iVar26 < (int)uVar39) * iVar26 | (iVar26 >= (int)uVar39) * uVar39;
    uVar50 = (uint)(iVar26 < (int)uVar42) * iVar26 | (iVar26 >= (int)uVar42) * uVar42;
    uVar51 = (uint)(iVar26 < (int)uVar44) * iVar26 | (iVar26 >= (int)uVar44) * uVar44;
    uVar52 = (uint)(iVar26 < (int)uVar46) * iVar26 | (iVar26 >= (int)uVar46) * uVar46;
    uVar39 = (uint)(iVar79 < iVar25) * iVar25 | (uint)(iVar79 >= iVar25) * iVar79;
    uVar42 = (uint)(iVar81 < iVar25) * iVar25 | (uint)(iVar81 >= iVar25) * iVar81;
    uVar44 = (uint)(iVar82 < iVar25) * iVar25 | (uint)(iVar82 >= iVar25) * iVar82;
    uVar46 = (uint)(iVar83 < iVar25) * iVar25 | (uint)(iVar83 >= iVar25) * iVar83;
    uVar39 = (uint)(iVar26 < (int)uVar39) * iVar26 | (iVar26 >= (int)uVar39) * uVar39;
    uVar42 = (uint)(iVar26 < (int)uVar42) * iVar26 | (iVar26 >= (int)uVar42) * uVar42;
    uVar44 = (uint)(iVar26 < (int)uVar44) * iVar26 | (iVar26 >= (int)uVar44) * uVar44;
    uVar46 = (uint)(iVar26 < (int)uVar46) * iVar26 | (iVar26 >= (int)uVar46) * uVar46;
    iVar38 = (int)(uVar85 + iVar27) >> auVar2;
    iVar41 = (int)(uVar87 + iVar27) >> auVar2;
    iVar43 = (int)(uVar89 + iVar27) >> auVar2;
    iVar45 = (int)(uVar91 + iVar27) >> auVar2;
    iVar34 = iVar27 - iVar34 >> auVar2;
    iVar36 = iVar27 - iVar36 >> auVar2;
    iVar8 = iVar27 - iVar8 >> auVar2;
    iVar9 = iVar27 - iVar9 >> auVar2;
    uVar85 = (uint)(iVar38 < iVar25) * iVar25 | (uint)(iVar38 >= iVar25) * iVar38;
    uVar87 = (uint)(iVar41 < iVar25) * iVar25 | (uint)(iVar41 >= iVar25) * iVar41;
    uVar89 = (uint)(iVar43 < iVar25) * iVar25 | (uint)(iVar43 >= iVar25) * iVar43;
    uVar91 = (uint)(iVar45 < iVar25) * iVar25 | (uint)(iVar45 >= iVar25) * iVar45;
    uVar85 = (uint)(iVar26 < (int)uVar85) * iVar26 | (iVar26 >= (int)uVar85) * uVar85;
    uVar87 = (uint)(iVar26 < (int)uVar87) * iVar26 | (iVar26 >= (int)uVar87) * uVar87;
    uVar89 = (uint)(iVar26 < (int)uVar89) * iVar26 | (iVar26 >= (int)uVar89) * uVar89;
    uVar91 = (uint)(iVar26 < (int)uVar91) * iVar26 | (iVar26 >= (int)uVar91) * uVar91;
    uVar58 = (uint)(iVar34 < iVar25) * iVar25 | (uint)(iVar34 >= iVar25) * iVar34;
    uVar64 = (uint)(iVar36 < iVar25) * iVar25 | (uint)(iVar36 >= iVar25) * iVar36;
    uVar68 = (uint)(iVar8 < iVar25) * iVar25 | (uint)(iVar8 >= iVar25) * iVar8;
    uVar72 = (uint)(iVar9 < iVar25) * iVar25 | (uint)(iVar9 >= iVar25) * iVar9;
    uVar58 = (uint)(iVar26 < (int)uVar58) * iVar26 | (iVar26 >= (int)uVar58) * uVar58;
    uVar64 = (uint)(iVar26 < (int)uVar64) * iVar26 | (iVar26 >= (int)uVar64) * uVar64;
    uVar68 = (uint)(iVar26 < (int)uVar68) * iVar26 | (iVar26 >= (int)uVar68) * uVar68;
    uVar72 = (uint)(iVar26 < (int)uVar72) * iVar26 | (iVar26 >= (int)uVar72) * uVar72;
    iVar34 = (int)(uVar56 + iVar27) >> auVar2;
    iVar36 = (int)(uVar62 + iVar27) >> auVar2;
    iVar8 = (int)(uVar66 + iVar27) >> auVar2;
    iVar9 = (int)(uVar70 + iVar27) >> auVar2;
    iVar13 = iVar27 - iVar13 >> auVar2;
    iVar18 = iVar27 - iVar18 >> auVar2;
    iVar20 = iVar27 - iVar20 >> auVar2;
    iVar22 = iVar27 - iVar22 >> auVar2;
    uVar56 = (uint)(iVar34 < iVar25) * iVar25 | (uint)(iVar34 >= iVar25) * iVar34;
    uVar62 = (uint)(iVar36 < iVar25) * iVar25 | (uint)(iVar36 >= iVar25) * iVar36;
    uVar66 = (uint)(iVar8 < iVar25) * iVar25 | (uint)(iVar8 >= iVar25) * iVar8;
    uVar70 = (uint)(iVar9 < iVar25) * iVar25 | (uint)(iVar9 >= iVar25) * iVar9;
    uVar56 = (uint)(iVar26 < (int)uVar56) * iVar26 | (iVar26 >= (int)uVar56) * uVar56;
    uVar62 = (uint)(iVar26 < (int)uVar62) * iVar26 | (iVar26 >= (int)uVar62) * uVar62;
    uVar66 = (uint)(iVar26 < (int)uVar66) * iVar26 | (iVar26 >= (int)uVar66) * uVar66;
    uVar70 = (uint)(iVar26 < (int)uVar70) * iVar26 | (iVar26 >= (int)uVar70) * uVar70;
    uVar73 = (uint)(iVar13 < iVar25) * iVar25 | (uint)(iVar13 >= iVar25) * iVar13;
    uVar75 = (uint)(iVar18 < iVar25) * iVar25 | (uint)(iVar18 >= iVar25) * iVar18;
    uVar76 = (uint)(iVar20 < iVar25) * iVar25 | (uint)(iVar20 >= iVar25) * iVar20;
    uVar77 = (uint)(iVar22 < iVar25) * iVar25 | (uint)(iVar22 >= iVar25) * iVar22;
    uVar73 = (uint)(iVar26 < (int)uVar73) * iVar26 | (iVar26 >= (int)uVar73) * uVar73;
    uVar75 = (uint)(iVar26 < (int)uVar75) * iVar26 | (iVar26 >= (int)uVar75) * uVar75;
    uVar76 = (uint)(iVar26 < (int)uVar76) * iVar26 | (iVar26 >= (int)uVar76) * uVar76;
    uVar77 = (uint)(iVar26 < (int)uVar77) * iVar26 | (iVar26 >= (int)uVar77) * uVar77;
    iVar13 = (int)(uVar57 + iVar27) >> auVar2;
    iVar18 = (int)(uVar63 + iVar27) >> auVar2;
    iVar20 = (int)(uVar67 + iVar27) >> auVar2;
    iVar22 = (int)(uVar71 + iVar27) >> auVar2;
    iVar34 = (int)(iVar27 - uVar14) >> auVar2;
    iVar36 = (int)(iVar27 - uVar19) >> auVar2;
    iVar8 = (int)(iVar27 - uVar21) >> auVar2;
    iVar9 = (int)(iVar27 - uVar23) >> auVar2;
    uVar14 = (uint)(iVar13 < iVar25) * iVar25 | (uint)(iVar13 >= iVar25) * iVar13;
    uVar19 = (uint)(iVar18 < iVar25) * iVar25 | (uint)(iVar18 >= iVar25) * iVar18;
    uVar21 = (uint)(iVar20 < iVar25) * iVar25 | (uint)(iVar20 >= iVar25) * iVar20;
    uVar23 = (uint)(iVar22 < iVar25) * iVar25 | (uint)(iVar22 >= iVar25) * iVar22;
    uVar57 = (uint)(iVar26 < (int)uVar14) * iVar26 | (iVar26 >= (int)uVar14) * uVar14;
    uVar63 = (uint)(iVar26 < (int)uVar19) * iVar26 | (iVar26 >= (int)uVar19) * uVar19;
    uVar67 = (uint)(iVar26 < (int)uVar21) * iVar26 | (iVar26 >= (int)uVar21) * uVar21;
    uVar71 = (uint)(iVar26 < (int)uVar23) * iVar26 | (iVar26 >= (int)uVar23) * uVar23;
    uVar14 = (uint)(iVar34 < iVar25) * iVar25 | (uint)(iVar34 >= iVar25) * iVar34;
    uVar19 = (uint)(iVar36 < iVar25) * iVar25 | (uint)(iVar36 >= iVar25) * iVar36;
    uVar21 = (uint)(iVar8 < iVar25) * iVar25 | (uint)(iVar8 >= iVar25) * iVar8;
    uVar23 = (uint)(iVar9 < iVar25) * iVar25 | (uint)(iVar9 >= iVar25) * iVar9;
    uVar14 = (uint)(iVar26 < (int)uVar14) * iVar26 | (iVar26 >= (int)uVar14) * uVar14;
    uVar19 = (uint)(iVar26 < (int)uVar19) * iVar26 | (iVar26 >= (int)uVar19) * uVar19;
    uVar21 = (uint)(iVar26 < (int)uVar21) * iVar26 | (iVar26 >= (int)uVar21) * uVar21;
    uVar23 = (uint)(iVar26 < (int)uVar23) * iVar26 | (iVar26 >= (int)uVar23) * uVar23;
  }
  else {
    uVar39 = -uVar39;
    uVar42 = -uVar42;
    uVar44 = -uVar44;
    uVar46 = -uVar46;
    uVar58 = -iVar34;
    uVar64 = -iVar36;
    uVar68 = -iVar8;
    uVar72 = -iVar9;
    uVar73 = -iVar13;
    uVar75 = -iVar18;
    uVar76 = -iVar20;
    uVar77 = -iVar22;
    uVar14 = -uVar14;
    uVar19 = -uVar19;
    uVar21 = -uVar21;
    uVar23 = -uVar23;
  }
  *(uint *)*out = uVar48;
  *(uint *)((long)*out + 4) = uVar50;
  *(uint *)(*out + 1) = uVar51;
  *(uint *)((long)*out + 0xc) = uVar52;
  *(uint *)out[2] = uVar39;
  *(uint *)((long)out[2] + 4) = uVar42;
  *(uint *)(out[2] + 1) = uVar44;
  *(uint *)((long)out[2] + 0xc) = uVar46;
  *(uint *)out[4] = uVar85;
  *(uint *)((long)out[4] + 4) = uVar87;
  *(uint *)(out[4] + 1) = uVar89;
  *(uint *)((long)out[4] + 0xc) = uVar91;
  *(uint *)out[6] = uVar58;
  *(uint *)((long)out[6] + 4) = uVar64;
  *(uint *)(out[6] + 1) = uVar68;
  *(uint *)((long)out[6] + 0xc) = uVar72;
  *(uint *)out[8] = uVar56;
  *(uint *)((long)out[8] + 4) = uVar62;
  *(uint *)(out[8] + 1) = uVar66;
  *(uint *)((long)out[8] + 0xc) = uVar70;
  *(uint *)out[10] = uVar73;
  *(uint *)((long)out[10] + 4) = uVar75;
  *(uint *)(out[10] + 1) = uVar76;
  *(uint *)((long)out[10] + 0xc) = uVar77;
  *(uint *)out[0xc] = uVar57;
  *(uint *)((long)out[0xc] + 4) = uVar63;
  *(uint *)(out[0xc] + 1) = uVar67;
  *(uint *)((long)out[0xc] + 0xc) = uVar71;
  *(uint *)out[0xe] = uVar14;
  *(uint *)((long)out[0xe] + 4) = uVar19;
  *(uint *)(out[0xe] + 1) = uVar21;
  *(uint *)((long)out[0xe] + 0xc) = uVar23;
  auVar2 = pmulld((undefined1  [16])in[0xf],auVar17);
  auVar11 = pmulld(auVar17,(undefined1  [16])in[1]);
  auVar17 = pmulld((undefined1  [16])in[1],auVar78);
  auVar59 = pmulld((undefined1  [16])in[0xf],auVar78);
  auVar3 = pmulld((undefined1  [16])in[0xb],auVar31);
  auVar31 = pmulld(auVar31,(undefined1  [16])in[5]);
  auVar16 = pmulld((undefined1  [16])in[5],auVar49);
  auVar49 = pmulld((undefined1  [16])in[0xb],auVar49);
  auVar4 = pmulld((undefined1  [16])in[7],auVar74);
  auVar30 = pmulld(auVar74,(undefined1  [16])in[9]);
  auVar24 = pmulld((undefined1  [16])in[9],auVar54);
  auVar15 = pmulld((undefined1  [16])in[7],auVar54);
  auVar7 = pmulld((undefined1  [16])in[3],auVar53);
  auVar78 = pmulld(auVar53,(undefined1  [16])in[0xd]);
  auVar40 = pmulld((undefined1  [16])in[0xd],auVar47);
  auVar54 = pmulld((undefined1  [16])in[3],auVar47);
  iVar13 = auVar17._0_4_ + auVar2._0_4_ + iVar94 >> 0xc;
  iVar18 = auVar17._4_4_ + auVar2._4_4_ + iVar100 >> 0xc;
  iVar20 = auVar17._8_4_ + auVar2._8_4_ + iVar103 >> 0xc;
  iVar22 = auVar17._12_4_ + auVar2._12_4_ + iVar107 >> 0xc;
  iVar61 = (auVar59._0_4_ - auVar11._0_4_) + iVar94 >> 0xc;
  iVar65 = (auVar59._4_4_ - auVar11._4_4_) + iVar100 >> 0xc;
  iVar69 = (auVar59._8_4_ - auVar11._8_4_) + iVar103 >> 0xc;
  iVar105 = (auVar59._12_4_ - auVar11._12_4_) + iVar107 >> 0xc;
  iVar41 = auVar16._0_4_ + auVar3._0_4_ + iVar94 >> 0xc;
  iVar43 = auVar16._4_4_ + auVar3._4_4_ + iVar100 >> 0xc;
  iVar45 = auVar16._8_4_ + auVar3._8_4_ + iVar103 >> 0xc;
  iVar79 = auVar16._12_4_ + auVar3._12_4_ + iVar107 >> 0xc;
  iVar86 = (auVar49._0_4_ - auVar31._0_4_) + iVar94 >> 0xc;
  iVar88 = (auVar49._4_4_ - auVar31._4_4_) + iVar100 >> 0xc;
  iVar90 = (auVar49._8_4_ - auVar31._8_4_) + iVar103 >> 0xc;
  iVar92 = (auVar49._12_4_ - auVar31._12_4_) + iVar107 >> 0xc;
  iVar81 = auVar24._0_4_ + auVar4._0_4_ + iVar94 >> 0xc;
  iVar82 = auVar24._4_4_ + auVar4._4_4_ + iVar100 >> 0xc;
  iVar83 = auVar24._8_4_ + auVar4._8_4_ + iVar103 >> 0xc;
  iVar84 = auVar24._12_4_ + auVar4._12_4_ + iVar107 >> 0xc;
  iVar25 = (auVar15._0_4_ - auVar30._0_4_) + iVar94 >> 0xc;
  iVar26 = (auVar15._4_4_ - auVar30._4_4_) + iVar100 >> 0xc;
  iVar27 = (auVar15._8_4_ - auVar30._8_4_) + iVar103 >> 0xc;
  iVar38 = (auVar15._12_4_ - auVar30._12_4_) + iVar107 >> 0xc;
  iVar33 = auVar40._0_4_ + auVar7._0_4_ + iVar94 >> 0xc;
  iVar35 = auVar40._4_4_ + auVar7._4_4_ + iVar100 >> 0xc;
  iVar37 = auVar40._8_4_ + auVar7._8_4_ + iVar103 >> 0xc;
  iVar55 = auVar40._12_4_ + auVar7._12_4_ + iVar107 >> 0xc;
  iVar98 = (auVar54._0_4_ - auVar78._0_4_) + iVar94 >> 0xc;
  iVar101 = (auVar54._4_4_ - auVar78._4_4_) + iVar100 >> 0xc;
  iVar104 = (auVar54._8_4_ - auVar78._8_4_) + iVar103 >> 0xc;
  iVar29 = (auVar54._12_4_ - auVar78._12_4_) + iVar107 >> 0xc;
  iVar34 = iVar81 + iVar13;
  iVar36 = iVar82 + iVar18;
  iVar8 = iVar83 + iVar20;
  iVar9 = iVar84 + iVar22;
  iVar13 = iVar13 - iVar81;
  iVar18 = iVar18 - iVar82;
  iVar20 = iVar20 - iVar83;
  iVar22 = iVar22 - iVar84;
  uVar39 = (uint)(iVar13 < iVar32) * iVar32 | (uint)(iVar13 >= iVar32) * iVar13;
  uVar42 = (uint)(iVar18 < iVar32) * iVar32 | (uint)(iVar18 >= iVar32) * iVar18;
  uVar44 = (uint)(iVar20 < iVar32) * iVar32 | (uint)(iVar20 >= iVar32) * iVar20;
  uVar46 = (uint)(iVar22 < iVar32) * iVar32 | (uint)(iVar22 >= iVar32) * iVar22;
  auVar40._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar40._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar40._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar40._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  iVar81 = iVar25 + iVar61;
  iVar82 = iVar26 + iVar65;
  iVar83 = iVar27 + iVar69;
  iVar84 = iVar38 + iVar105;
  iVar61 = iVar61 - iVar25;
  iVar65 = iVar65 - iVar26;
  iVar69 = iVar69 - iVar27;
  iVar105 = iVar105 - iVar38;
  uVar39 = (uint)(iVar61 < iVar32) * iVar32 | (uint)(iVar61 >= iVar32) * iVar61;
  uVar42 = (uint)(iVar65 < iVar32) * iVar32 | (uint)(iVar65 >= iVar32) * iVar65;
  uVar44 = (uint)(iVar69 < iVar32) * iVar32 | (uint)(iVar69 >= iVar32) * iVar69;
  uVar46 = (uint)(iVar105 < iVar32) * iVar32 | (uint)(iVar105 >= iVar32) * iVar105;
  auVar96._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar96._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar96._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar96._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  iVar13 = iVar33 + iVar41;
  iVar18 = iVar35 + iVar43;
  iVar20 = iVar37 + iVar45;
  iVar22 = iVar55 + iVar79;
  iVar41 = iVar41 - iVar33;
  iVar43 = iVar43 - iVar35;
  iVar45 = iVar45 - iVar37;
  iVar79 = iVar79 - iVar55;
  iVar25 = iVar98 + iVar86;
  iVar26 = iVar101 + iVar88;
  iVar27 = iVar104 + iVar90;
  iVar38 = iVar29 + iVar92;
  iVar86 = iVar86 - iVar98;
  iVar88 = iVar88 - iVar101;
  iVar90 = iVar90 - iVar104;
  iVar92 = iVar92 - iVar29;
  auVar3 = pmulld(auVar40,auVar10);
  auVar17 = pmulld(auVar10,auVar96);
  auVar31 = pmulld(auVar96,auVar12);
  auVar2 = pmulld(auVar40,auVar12);
  uVar39 = (uint)(iVar41 < iVar32) * iVar32 | (uint)(iVar41 >= iVar32) * iVar41;
  uVar42 = (uint)(iVar43 < iVar32) * iVar32 | (uint)(iVar43 >= iVar32) * iVar43;
  uVar44 = (uint)(iVar45 < iVar32) * iVar32 | (uint)(iVar45 >= iVar32) * iVar45;
  uVar46 = (uint)(iVar79 < iVar32) * iVar32 | (uint)(iVar79 >= iVar32) * iVar79;
  auVar80._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar80._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar80._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar80._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar39 = (uint)(iVar86 < iVar32) * iVar32 | (uint)(iVar86 >= iVar32) * iVar86;
  uVar42 = (uint)(iVar88 < iVar32) * iVar32 | (uint)(iVar88 >= iVar32) * iVar88;
  uVar44 = (uint)(iVar90 < iVar32) * iVar32 | (uint)(iVar90 >= iVar32) * iVar90;
  uVar46 = (uint)(iVar92 < iVar32) * iVar32 | (uint)(iVar92 >= iVar32) * iVar92;
  auVar95._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar95._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar95._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar95._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  auVar4 = pmulld(auVar80,auVar6);
  auVar11 = pmulld(auVar6,auVar95);
  auVar7 = pmulld(auVar95,auVar10);
  auVar6 = pmulld(auVar80,auVar10);
  uVar39 = (uint)(iVar34 < iVar32) * iVar32 | (uint)(iVar34 >= iVar32) * iVar34;
  uVar42 = (uint)(iVar36 < iVar32) * iVar32 | (uint)(iVar36 >= iVar32) * iVar36;
  uVar44 = (uint)(iVar8 < iVar32) * iVar32 | (uint)(iVar8 >= iVar32) * iVar8;
  uVar46 = (uint)(iVar9 < iVar32) * iVar32 | (uint)(iVar9 >= iVar32) * iVar9;
  uVar39 = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  uVar42 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  uVar44 = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  uVar46 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar14 = (uint)(iVar81 < iVar32) * iVar32 | (uint)(iVar81 >= iVar32) * iVar81;
  uVar19 = (uint)(iVar82 < iVar32) * iVar32 | (uint)(iVar82 >= iVar32) * iVar82;
  uVar21 = (uint)(iVar83 < iVar32) * iVar32 | (uint)(iVar83 >= iVar32) * iVar83;
  uVar23 = (uint)(iVar84 < iVar32) * iVar32 | (uint)(iVar84 >= iVar32) * iVar84;
  uVar56 = (uint)(iVar28 < (int)uVar14) * iVar28 | (iVar28 >= (int)uVar14) * uVar14;
  uVar62 = (uint)(iVar28 < (int)uVar19) * iVar28 | (iVar28 >= (int)uVar19) * uVar19;
  uVar66 = (uint)(iVar28 < (int)uVar21) * iVar28 | (iVar28 >= (int)uVar21) * uVar21;
  uVar70 = (uint)(iVar28 < (int)uVar23) * iVar28 | (iVar28 >= (int)uVar23) * uVar23;
  uVar14 = (uint)(iVar13 < iVar32) * iVar32 | (uint)(iVar13 >= iVar32) * iVar13;
  uVar19 = (uint)(iVar18 < iVar32) * iVar32 | (uint)(iVar18 >= iVar32) * iVar18;
  uVar21 = (uint)(iVar20 < iVar32) * iVar32 | (uint)(iVar20 >= iVar32) * iVar20;
  uVar23 = (uint)(iVar22 < iVar32) * iVar32 | (uint)(iVar22 >= iVar32) * iVar22;
  uVar14 = (uint)(iVar28 < (int)uVar14) * iVar28 | (iVar28 >= (int)uVar14) * uVar14;
  uVar19 = (uint)(iVar28 < (int)uVar19) * iVar28 | (iVar28 >= (int)uVar19) * uVar19;
  uVar21 = (uint)(iVar28 < (int)uVar21) * iVar28 | (iVar28 >= (int)uVar21) * uVar21;
  uVar23 = (uint)(iVar28 < (int)uVar23) * iVar28 | (iVar28 >= (int)uVar23) * uVar23;
  uVar48 = (uint)(iVar25 < iVar32) * iVar32 | (uint)(iVar25 >= iVar32) * iVar25;
  uVar50 = (uint)(iVar26 < iVar32) * iVar32 | (uint)(iVar26 >= iVar32) * iVar26;
  uVar51 = (uint)(iVar27 < iVar32) * iVar32 | (uint)(iVar27 >= iVar32) * iVar27;
  uVar52 = (uint)(iVar38 < iVar32) * iVar32 | (uint)(iVar38 >= iVar32) * iVar38;
  uVar48 = (uint)(iVar28 < (int)uVar48) * iVar28 | (iVar28 >= (int)uVar48) * uVar48;
  uVar50 = (uint)(iVar28 < (int)uVar50) * iVar28 | (iVar28 >= (int)uVar50) * uVar50;
  uVar51 = (uint)(iVar28 < (int)uVar51) * iVar28 | (iVar28 >= (int)uVar51) * uVar51;
  uVar52 = (uint)(iVar28 < (int)uVar52) * iVar28 | (iVar28 >= (int)uVar52) * uVar52;
  iVar61 = auVar31._0_4_ + auVar3._0_4_ + iVar94 >> 0xc;
  iVar65 = auVar31._4_4_ + auVar3._4_4_ + iVar100 >> 0xc;
  iVar69 = auVar31._8_4_ + auVar3._8_4_ + iVar103 >> 0xc;
  iVar105 = auVar31._12_4_ + auVar3._12_4_ + iVar107 >> 0xc;
  iVar13 = (auVar2._0_4_ - auVar17._0_4_) + iVar94 >> 0xc;
  iVar18 = (auVar2._4_4_ - auVar17._4_4_) + iVar100 >> 0xc;
  iVar20 = (auVar2._8_4_ - auVar17._8_4_) + iVar103 >> 0xc;
  iVar22 = (auVar2._12_4_ - auVar17._12_4_) + iVar107 >> 0xc;
  iVar81 = auVar7._0_4_ + auVar4._0_4_ + iVar94 >> 0xc;
  iVar82 = auVar7._4_4_ + auVar4._4_4_ + iVar100 >> 0xc;
  iVar83 = auVar7._8_4_ + auVar4._8_4_ + iVar103 >> 0xc;
  iVar84 = auVar7._12_4_ + auVar4._12_4_ + iVar107 >> 0xc;
  iVar41 = (auVar6._0_4_ - auVar11._0_4_) + iVar94 >> 0xc;
  iVar43 = (auVar6._4_4_ - auVar11._4_4_) + iVar100 >> 0xc;
  iVar45 = (auVar6._8_4_ - auVar11._8_4_) + iVar103 >> 0xc;
  iVar79 = (auVar6._12_4_ - auVar11._12_4_) + iVar107 >> 0xc;
  iVar25 = uVar14 + uVar39;
  iVar26 = uVar19 + uVar42;
  iVar27 = uVar21 + uVar44;
  iVar38 = uVar23 + uVar46;
  iVar34 = uVar39 - uVar14;
  iVar36 = uVar42 - uVar19;
  iVar8 = uVar44 - uVar21;
  iVar9 = uVar46 - uVar23;
  iVar86 = uVar48 + uVar56;
  iVar88 = uVar50 + uVar62;
  iVar90 = uVar51 + uVar66;
  iVar92 = uVar52 + uVar70;
  iVar98 = uVar56 - uVar48;
  iVar101 = uVar62 - uVar50;
  iVar104 = uVar66 - uVar51;
  iVar29 = uVar70 - uVar52;
  iVar33 = iVar81 + iVar61;
  iVar35 = iVar82 + iVar65;
  iVar37 = iVar83 + iVar69;
  iVar55 = iVar84 + iVar105;
  iVar61 = iVar61 - iVar81;
  iVar65 = iVar65 - iVar82;
  iVar69 = iVar69 - iVar83;
  iVar105 = iVar105 - iVar84;
  iVar81 = iVar41 + iVar13;
  iVar82 = iVar43 + iVar18;
  iVar83 = iVar45 + iVar20;
  iVar84 = iVar79 + iVar22;
  iVar13 = iVar13 - iVar41;
  iVar18 = iVar18 - iVar43;
  iVar20 = iVar20 - iVar45;
  iVar22 = iVar22 - iVar79;
  uVar14 = (uint)(iVar25 < iVar32) * iVar32 | (uint)(iVar25 >= iVar32) * iVar25;
  uVar19 = (uint)(iVar26 < iVar32) * iVar32 | (uint)(iVar26 >= iVar32) * iVar26;
  uVar21 = (uint)(iVar27 < iVar32) * iVar32 | (uint)(iVar27 >= iVar32) * iVar27;
  uVar23 = (uint)(iVar38 < iVar32) * iVar32 | (uint)(iVar38 >= iVar32) * iVar38;
  uVar39 = (uint)(iVar34 < iVar32) * iVar32 | (uint)(iVar34 >= iVar32) * iVar34;
  uVar42 = (uint)(iVar36 < iVar32) * iVar32 | (uint)(iVar36 >= iVar32) * iVar36;
  uVar44 = (uint)(iVar8 < iVar32) * iVar32 | (uint)(iVar8 >= iVar32) * iVar8;
  uVar46 = (uint)(iVar9 < iVar32) * iVar32 | (uint)(iVar9 >= iVar32) * iVar9;
  uVar85 = (uint)(iVar86 < iVar32) * iVar32 | (uint)(iVar86 >= iVar32) * iVar86;
  uVar87 = (uint)(iVar88 < iVar32) * iVar32 | (uint)(iVar88 >= iVar32) * iVar88;
  uVar89 = (uint)(iVar90 < iVar32) * iVar32 | (uint)(iVar90 >= iVar32) * iVar90;
  uVar91 = (uint)(iVar92 < iVar32) * iVar32 | (uint)(iVar92 >= iVar32) * iVar92;
  uVar58 = (uint)(iVar98 < iVar32) * iVar32 | (uint)(iVar98 >= iVar32) * iVar98;
  uVar64 = (uint)(iVar101 < iVar32) * iVar32 | (uint)(iVar101 >= iVar32) * iVar101;
  uVar68 = (uint)(iVar104 < iVar32) * iVar32 | (uint)(iVar104 >= iVar32) * iVar104;
  uVar72 = (uint)(iVar29 < iVar32) * iVar32 | (uint)(iVar29 >= iVar32) * iVar29;
  uVar73 = (uint)(iVar33 < iVar32) * iVar32 | (uint)(iVar33 >= iVar32) * iVar33;
  uVar75 = (uint)(iVar35 < iVar32) * iVar32 | (uint)(iVar35 >= iVar32) * iVar35;
  uVar76 = (uint)(iVar37 < iVar32) * iVar32 | (uint)(iVar37 >= iVar32) * iVar37;
  uVar77 = (uint)(iVar55 < iVar32) * iVar32 | (uint)(iVar55 >= iVar32) * iVar55;
  uVar93 = (uint)(iVar61 < iVar32) * iVar32 | (uint)(iVar61 >= iVar32) * iVar61;
  uVar99 = (uint)(iVar65 < iVar32) * iVar32 | (uint)(iVar65 >= iVar32) * iVar65;
  uVar102 = (uint)(iVar69 < iVar32) * iVar32 | (uint)(iVar69 >= iVar32) * iVar69;
  uVar106 = (uint)(iVar105 < iVar32) * iVar32 | (uint)(iVar105 >= iVar32) * iVar105;
  uVar48 = (uint)(iVar81 < iVar32) * iVar32 | (uint)(iVar81 >= iVar32) * iVar81;
  uVar50 = (uint)(iVar82 < iVar32) * iVar32 | (uint)(iVar82 >= iVar32) * iVar82;
  uVar51 = (uint)(iVar83 < iVar32) * iVar32 | (uint)(iVar83 >= iVar32) * iVar83;
  uVar52 = (uint)(iVar84 < iVar32) * iVar32 | (uint)(iVar84 >= iVar32) * iVar84;
  uVar56 = (uint)(iVar13 < iVar32) * iVar32 | (uint)(iVar13 >= iVar32) * iVar13;
  uVar62 = (uint)(iVar18 < iVar32) * iVar32 | (uint)(iVar18 >= iVar32) * iVar18;
  uVar66 = (uint)(iVar20 < iVar32) * iVar32 | (uint)(iVar20 >= iVar32) * iVar20;
  uVar70 = (uint)(iVar22 < iVar32) * iVar32 | (uint)(iVar22 >= iVar32) * iVar22;
  uVar57 = (uint)(iVar28 < (int)uVar14) * iVar28 | (iVar28 >= (int)uVar14) * uVar14;
  uVar63 = (uint)(iVar28 < (int)uVar19) * iVar28 | (iVar28 >= (int)uVar19) * uVar19;
  uVar67 = (uint)(iVar28 < (int)uVar21) * iVar28 | (iVar28 >= (int)uVar21) * uVar21;
  uVar71 = (uint)(iVar28 < (int)uVar23) * iVar28 | (iVar28 >= (int)uVar23) * uVar23;
  auVar30._0_4_ = (uint)(iVar28 < (int)uVar39) * iVar28 | (iVar28 >= (int)uVar39) * uVar39;
  auVar30._4_4_ = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
  auVar30._8_4_ = (uint)(iVar28 < (int)uVar44) * iVar28 | (iVar28 >= (int)uVar44) * uVar44;
  auVar30._12_4_ = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
  uVar14 = (uint)(iVar28 < (int)uVar85) * iVar28 | (iVar28 >= (int)uVar85) * uVar85;
  uVar19 = (uint)(iVar28 < (int)uVar87) * iVar28 | (iVar28 >= (int)uVar87) * uVar87;
  uVar21 = (uint)(iVar28 < (int)uVar89) * iVar28 | (iVar28 >= (int)uVar89) * uVar89;
  uVar23 = (uint)(iVar28 < (int)uVar91) * iVar28 | (iVar28 >= (int)uVar91) * uVar91;
  auVar60._0_4_ = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  auVar60._4_4_ = (uint)(iVar28 < (int)uVar64) * iVar28 | (iVar28 >= (int)uVar64) * uVar64;
  auVar60._8_4_ = (uint)(iVar28 < (int)uVar68) * iVar28 | (iVar28 >= (int)uVar68) * uVar68;
  auVar60._12_4_ = (uint)(iVar28 < (int)uVar72) * iVar28 | (iVar28 >= (int)uVar72) * uVar72;
  uVar39 = (uint)(iVar28 < (int)uVar73) * iVar28 | (iVar28 >= (int)uVar73) * uVar73;
  uVar42 = (uint)(iVar28 < (int)uVar75) * iVar28 | (iVar28 >= (int)uVar75) * uVar75;
  uVar44 = (uint)(iVar28 < (int)uVar76) * iVar28 | (iVar28 >= (int)uVar76) * uVar76;
  uVar46 = (uint)(iVar28 < (int)uVar77) * iVar28 | (iVar28 >= (int)uVar77) * uVar77;
  auVar97._0_4_ = (uint)(iVar28 < (int)uVar93) * iVar28 | (iVar28 >= (int)uVar93) * uVar93;
  auVar97._4_4_ = (uint)(iVar28 < (int)uVar99) * iVar28 | (iVar28 >= (int)uVar99) * uVar99;
  auVar97._8_4_ = (uint)(iVar28 < (int)uVar102) * iVar28 | (iVar28 >= (int)uVar102) * uVar102;
  auVar97._12_4_ = (uint)(iVar28 < (int)uVar106) * iVar28 | (iVar28 >= (int)uVar106) * uVar106;
  uVar85 = (uint)(iVar28 < (int)uVar48) * iVar28 | (iVar28 >= (int)uVar48) * uVar48;
  uVar87 = (uint)(iVar28 < (int)uVar50) * iVar28 | (iVar28 >= (int)uVar50) * uVar50;
  uVar89 = (uint)(iVar28 < (int)uVar51) * iVar28 | (iVar28 >= (int)uVar51) * uVar51;
  uVar91 = (uint)(iVar28 < (int)uVar52) * iVar28 | (iVar28 >= (int)uVar52) * uVar52;
  auVar59._0_4_ = (uint)(iVar28 < (int)uVar56) * iVar28 | (iVar28 >= (int)uVar56) * uVar56;
  auVar59._4_4_ = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  auVar59._8_4_ = (uint)(iVar28 < (int)uVar66) * iVar28 | (iVar28 >= (int)uVar66) * uVar66;
  auVar59._12_4_ = (uint)(iVar28 < (int)uVar70) * iVar28 | (iVar28 >= (int)uVar70) * uVar70;
  auVar2 = pmulld(auVar30,auVar5);
  auVar4 = pmulld(auVar60,auVar5);
  auVar6 = pmulld(auVar97,auVar5);
  auVar3 = pmulld(auVar59,auVar5);
  iVar28 = auVar4._0_4_ + auVar2._0_4_ + iVar94 >> 0xc;
  iVar32 = auVar4._4_4_ + auVar2._4_4_ + iVar100 >> 0xc;
  iVar34 = auVar4._8_4_ + auVar2._8_4_ + iVar103 >> 0xc;
  iVar36 = auVar4._12_4_ + auVar2._12_4_ + iVar107 >> 0xc;
  uVar56 = (auVar2._0_4_ - auVar4._0_4_) + iVar94 >> 0xc;
  uVar62 = (auVar2._4_4_ - auVar4._4_4_) + iVar100 >> 0xc;
  uVar66 = (auVar2._8_4_ - auVar4._8_4_) + iVar103 >> 0xc;
  uVar70 = (auVar2._12_4_ - auVar4._12_4_) + iVar107 >> 0xc;
  uVar48 = auVar3._0_4_ + auVar6._0_4_ + iVar94 >> 0xc;
  uVar50 = auVar3._4_4_ + auVar6._4_4_ + iVar100 >> 0xc;
  uVar51 = auVar3._8_4_ + auVar6._8_4_ + iVar103 >> 0xc;
  uVar52 = auVar3._12_4_ + auVar6._12_4_ + iVar107 >> 0xc;
  iVar94 = (auVar6._0_4_ - auVar3._0_4_) + iVar94 >> 0xc;
  iVar100 = (auVar6._4_4_ - auVar3._4_4_) + iVar100 >> 0xc;
  iVar103 = (auVar6._8_4_ - auVar3._8_4_) + iVar103 >> 0xc;
  iVar107 = (auVar6._12_4_ - auVar3._12_4_) + iVar107 >> 0xc;
  if (bit == 0) {
    bVar1 = 10;
    if (10 < do_cols) {
      bVar1 = (byte)do_cols;
    }
    iVar8 = 0x20 << (bVar1 & 0x1f);
    iVar9 = -iVar8;
    iVar8 = iVar8 + -1;
    iVar13 = (1 << ((byte)bd & 0x1f)) >> 1;
    auVar2 = ZEXT416((uint)bd);
    iVar26 = (int)(uVar57 + iVar13) >> auVar2;
    iVar27 = (int)(uVar63 + iVar13) >> auVar2;
    iVar38 = (int)(uVar67 + iVar13) >> auVar2;
    iVar41 = (int)(uVar71 + iVar13) >> auVar2;
    iVar18 = (int)(iVar13 - uVar39) >> auVar2;
    iVar20 = (int)(iVar13 - uVar42) >> auVar2;
    iVar22 = (int)(iVar13 - uVar44) >> auVar2;
    iVar25 = (int)(iVar13 - uVar46) >> auVar2;
    uVar39 = (uint)(iVar26 < iVar9) * iVar9 | (uint)(iVar26 >= iVar9) * iVar26;
    uVar42 = (uint)(iVar27 < iVar9) * iVar9 | (uint)(iVar27 >= iVar9) * iVar27;
    uVar44 = (uint)(iVar38 < iVar9) * iVar9 | (uint)(iVar38 >= iVar9) * iVar38;
    uVar46 = (uint)(iVar41 < iVar9) * iVar9 | (uint)(iVar41 >= iVar9) * iVar41;
    uVar57 = (uint)(iVar8 < (int)uVar39) * iVar8 | (iVar8 >= (int)uVar39) * uVar39;
    uVar63 = (uint)(iVar8 < (int)uVar42) * iVar8 | (iVar8 >= (int)uVar42) * uVar42;
    uVar67 = (uint)(iVar8 < (int)uVar44) * iVar8 | (iVar8 >= (int)uVar44) * uVar44;
    uVar71 = (uint)(iVar8 < (int)uVar46) * iVar8 | (iVar8 >= (int)uVar46) * uVar46;
    uVar39 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
    uVar42 = (uint)(iVar20 < iVar9) * iVar9 | (uint)(iVar20 >= iVar9) * iVar20;
    uVar44 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
    uVar46 = (uint)(iVar25 < iVar9) * iVar9 | (uint)(iVar25 >= iVar9) * iVar25;
    uVar39 = (uint)(iVar8 < (int)uVar39) * iVar8 | (iVar8 >= (int)uVar39) * uVar39;
    uVar42 = (uint)(iVar8 < (int)uVar42) * iVar8 | (iVar8 >= (int)uVar42) * uVar42;
    uVar44 = (uint)(iVar8 < (int)uVar44) * iVar8 | (iVar8 >= (int)uVar44) * uVar44;
    uVar46 = (uint)(iVar8 < (int)uVar46) * iVar8 | (iVar8 >= (int)uVar46) * uVar46;
    iVar18 = (int)(uVar48 + iVar13) >> auVar2;
    iVar20 = (int)(uVar50 + iVar13) >> auVar2;
    iVar22 = (int)(uVar51 + iVar13) >> auVar2;
    iVar25 = (int)(uVar52 + iVar13) >> auVar2;
    iVar28 = iVar13 - iVar28 >> auVar2;
    iVar32 = iVar13 - iVar32 >> auVar2;
    iVar34 = iVar13 - iVar34 >> auVar2;
    iVar36 = iVar13 - iVar36 >> auVar2;
    uVar48 = (uint)(iVar18 < iVar9) * iVar9 | (uint)(iVar18 >= iVar9) * iVar18;
    uVar50 = (uint)(iVar20 < iVar9) * iVar9 | (uint)(iVar20 >= iVar9) * iVar20;
    uVar51 = (uint)(iVar22 < iVar9) * iVar9 | (uint)(iVar22 >= iVar9) * iVar22;
    uVar52 = (uint)(iVar25 < iVar9) * iVar9 | (uint)(iVar25 >= iVar9) * iVar25;
    uVar48 = (uint)(iVar8 < (int)uVar48) * iVar8 | (iVar8 >= (int)uVar48) * uVar48;
    uVar50 = (uint)(iVar8 < (int)uVar50) * iVar8 | (iVar8 >= (int)uVar50) * uVar50;
    uVar51 = (uint)(iVar8 < (int)uVar51) * iVar8 | (iVar8 >= (int)uVar51) * uVar51;
    uVar52 = (uint)(iVar8 < (int)uVar52) * iVar8 | (iVar8 >= (int)uVar52) * uVar52;
    uVar58 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
    uVar64 = (uint)(iVar32 < iVar9) * iVar9 | (uint)(iVar32 >= iVar9) * iVar32;
    uVar68 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
    uVar72 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
    uVar58 = (uint)(iVar8 < (int)uVar58) * iVar8 | (iVar8 >= (int)uVar58) * uVar58;
    uVar64 = (uint)(iVar8 < (int)uVar64) * iVar8 | (iVar8 >= (int)uVar64) * uVar64;
    uVar68 = (uint)(iVar8 < (int)uVar68) * iVar8 | (iVar8 >= (int)uVar68) * uVar68;
    uVar72 = (uint)(iVar8 < (int)uVar72) * iVar8 | (iVar8 >= (int)uVar72) * uVar72;
    iVar28 = (int)(uVar56 + iVar13) >> auVar2;
    iVar32 = (int)(uVar62 + iVar13) >> auVar2;
    iVar34 = (int)(uVar66 + iVar13) >> auVar2;
    iVar36 = (int)(uVar70 + iVar13) >> auVar2;
    iVar94 = iVar13 - iVar94 >> auVar2;
    iVar100 = iVar13 - iVar100 >> auVar2;
    iVar103 = iVar13 - iVar103 >> auVar2;
    iVar107 = iVar13 - iVar107 >> auVar2;
    uVar56 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
    uVar62 = (uint)(iVar32 < iVar9) * iVar9 | (uint)(iVar32 >= iVar9) * iVar32;
    uVar66 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
    uVar70 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
    uVar56 = (uint)(iVar8 < (int)uVar56) * iVar8 | (iVar8 >= (int)uVar56) * uVar56;
    uVar62 = (uint)(iVar8 < (int)uVar62) * iVar8 | (iVar8 >= (int)uVar62) * uVar62;
    uVar66 = (uint)(iVar8 < (int)uVar66) * iVar8 | (iVar8 >= (int)uVar66) * uVar66;
    uVar70 = (uint)(iVar8 < (int)uVar70) * iVar8 | (iVar8 >= (int)uVar70) * uVar70;
    uVar73 = (uint)(iVar94 < iVar9) * iVar9 | (uint)(iVar94 >= iVar9) * iVar94;
    uVar75 = (uint)(iVar100 < iVar9) * iVar9 | (uint)(iVar100 >= iVar9) * iVar100;
    uVar76 = (uint)(iVar103 < iVar9) * iVar9 | (uint)(iVar103 >= iVar9) * iVar103;
    uVar77 = (uint)(iVar107 < iVar9) * iVar9 | (uint)(iVar107 >= iVar9) * iVar107;
    uVar73 = (uint)(iVar8 < (int)uVar73) * iVar8 | (iVar8 >= (int)uVar73) * uVar73;
    uVar75 = (uint)(iVar8 < (int)uVar75) * iVar8 | (iVar8 >= (int)uVar75) * uVar75;
    uVar76 = (uint)(iVar8 < (int)uVar76) * iVar8 | (iVar8 >= (int)uVar76) * uVar76;
    uVar77 = (uint)(iVar8 < (int)uVar77) * iVar8 | (iVar8 >= (int)uVar77) * uVar77;
    iVar103 = (int)(uVar85 + iVar13) >> auVar2;
    iVar107 = (int)(uVar87 + iVar13) >> auVar2;
    iVar34 = (int)(uVar89 + iVar13) >> auVar2;
    iVar36 = (int)(uVar91 + iVar13) >> auVar2;
    iVar28 = (int)(iVar13 - uVar14) >> auVar2;
    iVar32 = (int)(iVar13 - uVar19) >> auVar2;
    iVar94 = (int)(iVar13 - uVar21) >> auVar2;
    iVar100 = (int)(iVar13 - uVar23) >> auVar2;
    uVar14 = (uint)(iVar103 < iVar9) * iVar9 | (uint)(iVar103 >= iVar9) * iVar103;
    uVar19 = (uint)(iVar107 < iVar9) * iVar9 | (uint)(iVar107 >= iVar9) * iVar107;
    uVar21 = (uint)(iVar34 < iVar9) * iVar9 | (uint)(iVar34 >= iVar9) * iVar34;
    uVar23 = (uint)(iVar36 < iVar9) * iVar9 | (uint)(iVar36 >= iVar9) * iVar36;
    uVar85 = (uint)(iVar8 < (int)uVar14) * iVar8 | (iVar8 >= (int)uVar14) * uVar14;
    uVar87 = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    uVar89 = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    uVar91 = (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    uVar14 = (uint)(iVar28 < iVar9) * iVar9 | (uint)(iVar28 >= iVar9) * iVar28;
    uVar19 = (uint)(iVar32 < iVar9) * iVar9 | (uint)(iVar32 >= iVar9) * iVar32;
    uVar21 = (uint)(iVar94 < iVar9) * iVar9 | (uint)(iVar94 >= iVar9) * iVar94;
    uVar23 = (uint)(iVar100 < iVar9) * iVar9 | (uint)(iVar100 >= iVar9) * iVar100;
    uVar14 = (uint)(iVar8 < (int)uVar14) * iVar8 | (iVar8 >= (int)uVar14) * uVar14;
    uVar19 = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    uVar21 = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    uVar23 = (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
  }
  else {
    uVar39 = -uVar39;
    uVar42 = -uVar42;
    uVar44 = -uVar44;
    uVar46 = -uVar46;
    uVar58 = -iVar28;
    uVar64 = -iVar32;
    uVar68 = -iVar34;
    uVar72 = -iVar36;
    uVar73 = -iVar94;
    uVar75 = -iVar100;
    uVar76 = -iVar103;
    uVar77 = -iVar107;
    uVar14 = -uVar14;
    uVar19 = -uVar19;
    uVar21 = -uVar21;
    uVar23 = -uVar23;
  }
  *(uint *)out[1] = uVar57;
  *(uint *)((long)out[1] + 4) = uVar63;
  *(uint *)(out[1] + 1) = uVar67;
  *(uint *)((long)out[1] + 0xc) = uVar71;
  *(uint *)out[3] = uVar39;
  *(uint *)((long)out[3] + 4) = uVar42;
  *(uint *)(out[3] + 1) = uVar44;
  *(uint *)((long)out[3] + 0xc) = uVar46;
  *(uint *)out[5] = uVar48;
  *(uint *)((long)out[5] + 4) = uVar50;
  *(uint *)(out[5] + 1) = uVar51;
  *(uint *)((long)out[5] + 0xc) = uVar52;
  *(uint *)out[7] = uVar58;
  *(uint *)((long)out[7] + 4) = uVar64;
  *(uint *)(out[7] + 1) = uVar68;
  *(uint *)((long)out[7] + 0xc) = uVar72;
  *(uint *)out[9] = uVar56;
  *(uint *)((long)out[9] + 4) = uVar62;
  *(uint *)(out[9] + 1) = uVar66;
  *(uint *)((long)out[9] + 0xc) = uVar70;
  *(uint *)out[0xb] = uVar73;
  *(uint *)((long)out[0xb] + 4) = uVar75;
  *(uint *)(out[0xb] + 1) = uVar76;
  *(uint *)((long)out[0xb] + 0xc) = uVar77;
  *(uint *)out[0xd] = uVar85;
  *(uint *)((long)out[0xd] + 4) = uVar87;
  *(uint *)(out[0xd] + 1) = uVar89;
  *(uint *)((long)out[0xd] + 0xc) = uVar91;
  *(uint *)out[0xf] = uVar14;
  *(uint *)((long)out[0xf] + 4) = uVar19;
  *(uint *)(out[0xf] + 1) = uVar21;
  *(uint *)((long)out[0xf] + 0xc) = uVar23;
  return;
}

Assistant:

static void iadst8x8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // Even 8 points: 0, 2, ..., 14
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[14], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[14], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[10], cospi20);
  x = _mm_mullo_epi32(in[4], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[10], cospi44);
  x = _mm_mullo_epi32(in[4], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[6], cospi36);
  x = _mm_mullo_epi32(in[8], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[6], cospi28);
  x = _mm_mullo_epi32(in[8], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[2], cospi52);
  x = _mm_mullo_epi32(in[12], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[2], cospi12);
  x = _mm_mullo_epi32(in[12], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[2] = _mm_sub_epi32(kZero, u[4]);
    out[4] = u[6];
    out[6] = _mm_sub_epi32(kZero, u[2]);
    out[8] = u[3];
    out[10] = _mm_sub_epi32(kZero, u[7]);
    out[12] = u[5];
    out[14] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 2, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 4, out + 6, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 8, out + 10, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 12, out + 14, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }

  // Odd 8 points: 1, 3, ..., 15
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[15], cospi4);
  x = _mm_mullo_epi32(in[1], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[15], cospi60);
  x = _mm_mullo_epi32(in[1], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[11], cospi20);
  x = _mm_mullo_epi32(in[5], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[11], cospi44);
  x = _mm_mullo_epi32(in[5], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[7], cospi36);
  x = _mm_mullo_epi32(in[9], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[7], cospi28);
  x = _mm_mullo_epi32(in[9], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[3], cospi52);
  x = _mm_mullo_epi32(in[13], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[3], cospi12);
  x = _mm_mullo_epi32(in[13], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[1] = u[0];
    out[3] = _mm_sub_epi32(kZero, u[4]);
    out[5] = u[6];
    out[7] = _mm_sub_epi32(kZero, u[2]);
    out[9] = u[3];
    out[11] = _mm_sub_epi32(kZero, u[7]);
    out[13] = u[5];
    out[15] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 1, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 5, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 9, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 13, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}